

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParsePITarget(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  byte *str1;
  xmlChar *pxVar2;
  xmlChar *in_R8;
  long lVar3;
  
  str1 = xmlParseName(ctxt);
  if (str1 == (byte *)0x0) {
    return (xmlChar *)0x0;
  }
  if ((((*str1 | 0x20) == 0x78) && ((str1[1] | 0x20) == 0x6d)) && ((str1[2] | 0x20) == 0x6c)) {
    if ((str1[2] == 0x6c && (str1[1] == 0x6d && *str1 == 0x78)) && (str1[3] == 0)) {
      xmlFatalErrMsg(ctxt,XML_ERR_RESERVED_XML_NAME,
                     "XML declaration allowed only at the start of the document\n");
      return str1;
    }
    if (str1[3] == 0) {
      xmlFatalErr(ctxt,XML_ERR_RESERVED_XML_NAME,(char *)0x0);
      return str1;
    }
    lVar3 = 0;
    do {
      iVar1 = xmlStrEqual(str1,*(xmlChar **)((long)xmlW3CPIs + lVar3));
      if (iVar1 != 0) {
        return str1;
      }
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x10);
    xmlWarningMsg(ctxt,XML_ERR_RESERVED_XML_NAME,"xmlParsePITarget: invalid name prefix \'xml\'\n",
                  (xmlChar *)0x0,in_R8);
  }
  pxVar2 = xmlStrchr(str1,':');
  if (pxVar2 != (xmlChar *)0x0) {
    xmlNsErr(ctxt,XML_NS_ERR_COLON,"colons are forbidden from PI names \'%s\'\n",str1,(xmlChar *)0x0
             ,(xmlChar *)0x0);
  }
  return str1;
}

Assistant:

const xmlChar *
xmlParsePITarget(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;

    name = xmlParseName(ctxt);
    if ((name != NULL) &&
        ((name[0] == 'x') || (name[0] == 'X')) &&
        ((name[1] == 'm') || (name[1] == 'M')) &&
        ((name[2] == 'l') || (name[2] == 'L'))) {
	int i;
	if ((name[0] == 'x') && (name[1] == 'm') &&
	    (name[2] == 'l') && (name[3] == 0)) {
	    xmlFatalErrMsg(ctxt, XML_ERR_RESERVED_XML_NAME,
		 "XML declaration allowed only at the start of the document\n");
	    return(name);
	} else if (name[3] == 0) {
	    xmlFatalErr(ctxt, XML_ERR_RESERVED_XML_NAME, NULL);
	    return(name);
	}
	for (i = 0;;i++) {
	    if (xmlW3CPIs[i] == NULL) break;
	    if (xmlStrEqual(name, (const xmlChar *)xmlW3CPIs[i]))
	        return(name);
	}
	xmlWarningMsg(ctxt, XML_ERR_RESERVED_XML_NAME,
		      "xmlParsePITarget: invalid name prefix 'xml'\n",
		      NULL, NULL);
    }
    if ((name != NULL) && (xmlStrchr(name, ':') != NULL)) {
	xmlNsErr(ctxt, XML_NS_ERR_COLON,
		 "colons are forbidden from PI names '%s'\n", name, NULL, NULL);
    }
    return(name);
}